

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool google::protobuf::io::Tokenizer::IsIdentifier(string *text)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ulong in_RDI;
  string *s;
  string local_30;
  ulong local_10;
  bool local_1;
  
  local_10 = in_RDI;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    local_1 = false;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::at(local_10);
    bVar1 = anon_unknown_4::Letter::InClass(*pcVar3);
    if (bVar1) {
      s = &local_30;
      std::__cxx11::string::substr((ulong)s,local_10);
      bVar1 = AllInClass<google::protobuf::io::(anonymous_namespace)::Alphanumeric>(s);
      std::__cxx11::string::~string((string *)&local_30);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Tokenizer::IsIdentifier(const std::string& text) {
  // Mirrors IDENTIFIER definition in Tokenizer::Next() above.
  if (text.size() == 0) return false;
  if (!Letter::InClass(text.at(0))) return false;
  if (!AllInClass<Alphanumeric>(text.substr(1))) return false;
  return true;
}